

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O2

pair<duckdb::TableFunction,_bool> * __thiscall
duckdb::FunctionSerializer::DeserializeBase<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
          (pair<duckdb::TableFunction,_bool> *__return_storage_ptr__,FunctionSerializer *this,
          Deserializer *deserializer,CatalogType catalog_type)

{
  bool bVar1;
  ClientContext *this_00;
  vector<duckdb::LogicalType,_true> original_arguments;
  vector<duckdb::LogicalType,_true> arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  TableFunction function;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_258;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  TableFunction local_1d8;
  
  this_00 = SerializationData::Get<duckdb::ClientContext&>((SerializationData *)(this + 0x10));
  Deserializer::ReadProperty<std::__cxx11::string>(&local_1f8,(Deserializer *)this,500,"name");
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_258,(Deserializer *)this,0x1f5,"arguments")
  ;
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&stack0xfffffffffffffd88,(Deserializer *)this,
             0x1f6,"original_arguments");
  local_218._M_dataplus._M_p =
       (pointer)local_258.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_218._M_string_length =
       (size_type)
       local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_218.field_2._M_allocated_capacity =
       (size_type)
       local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeserializeFunction<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
            (&local_1d8,(FunctionSerializer *)this_00,(ClientContext *)((ulong)deserializer & 0xff),
             (CatalogType)&local_1f8,&local_218,(vector<duckdb::LogicalType,_true> *)&local_238,
             (vector<duckdb::LogicalType,_true> *)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_238);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_218);
  bVar1 = Deserializer::ReadProperty<bool>((Deserializer *)this,0x1f7,"has_serialize");
  TableFunction::TableFunction(&__return_storage_ptr__->first,&local_1d8);
  __return_storage_ptr__->second = bVar1;
  TableFunction::~TableFunction(&local_1d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &stack0xfffffffffffffd88);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_258);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

static pair<FUNC, bool> DeserializeBase(Deserializer &deserializer, CatalogType catalog_type) {
		auto &context = deserializer.Get<ClientContext &>();
		auto name = deserializer.ReadProperty<string>(500, "name");
		auto arguments = deserializer.ReadProperty<vector<LogicalType>>(501, "arguments");
		auto original_arguments = deserializer.ReadProperty<vector<LogicalType>>(502, "original_arguments");
		auto function = DeserializeFunction<FUNC, CATALOG_ENTRY>(context, catalog_type, name, std::move(arguments),
		                                                         std::move(original_arguments));
		auto has_serialize = deserializer.ReadProperty<bool>(503, "has_serialize");
		return make_pair(std::move(function), has_serialize);
	}